

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

bool __thiscall Datetime::parse_off_ext(Datetime *this,Pig *pig)

{
  bool bVar1;
  int iVar2;
  uint c;
  undefined8 in_RAX;
  size_type previous;
  int iVar3;
  int iVar4;
  Datetime *pDVar5;
  int minute;
  int hour;
  
  _minute = in_RAX;
  previous = Pig::cursor(pig);
  iVar2 = Pig::peek(pig);
  if ((iVar2 == 0x2d) || (iVar2 == 0x2b)) {
    pDVar5 = (Datetime *)pig;
    Pig::skipN(pig,1);
    _minute = 0;
    bVar1 = parse_off_hour(pDVar5,pig,&hour);
    if (bVar1) {
      pDVar5 = (Datetime *)pig;
      bVar1 = Pig::skip(pig,0x3a);
      iVar3 = 0;
      if (bVar1) {
        bVar1 = parse_off_minute(pDVar5,pig,&minute);
        if (!bVar1) goto LAB_0012ed64;
        iVar3 = minute * 0x3c;
      }
      iVar3 = hour * 0xe10 + iVar3;
      iVar4 = -iVar3;
      if (iVar2 != 0x2d) {
        iVar4 = iVar3;
      }
      this->_offset = iVar4;
      c = Pig::peek(pig);
      bVar1 = unicodeLatinDigit(c);
      if (!bVar1) {
        return true;
      }
    }
  }
LAB_0012ed64:
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::parse_off_ext (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  int sign = pig.peek ();
  if (sign == '+' || sign == '-')
  {
    pig.skipN (1);

    int hour {0};
    int minute {0};

    if (parse_off_hour (pig, hour))
    {
      if (pig.skip (':'))
      {
        if (! parse_off_minute (pig, minute))
        {
          pig.restoreTo (checkpoint);
          return false;
        }
      }

      _offset = (hour * 3600) + (minute * 60);
      if (sign == '-')
        _offset = - _offset;

      if (! unicodeLatinDigit (pig.peek ()))
        return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}